

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

spv_result_t
spvOptimizerRun(spv_optimizer_t *optimizer,uint32_t *binary,size_t word_count,
               spv_binary *optimized_binary,spv_optimizer_options options)

{
  undefined1 auVar1 [16];
  bool bVar2;
  spv_binary __s;
  size_type sVar3;
  ulong uVar4;
  uint32_t *puVar5;
  uint *__src;
  spv_binary_t *result_binary;
  undefined1 local_50 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> optimized;
  spv_optimizer_options options_local;
  spv_binary *optimized_binary_local;
  size_t word_count_local;
  uint32_t *binary_local;
  spv_optimizer_t *optimizer_local;
  
  optimized.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)options;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  bVar2 = spvtools::Optimizer::Run
                    ((Optimizer *)optimizer,binary,word_count,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                     (spv_optimizer_options)
                     optimized.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar2) {
    __s = (spv_binary)operator_new(0x10);
    memset(__s,0,0x10);
    if (__s == (spv_binary)0x0) {
      *optimized_binary = (spv_binary)0x0;
      optimizer_local._4_4_ = SPV_ERROR_OUT_OF_MEMORY;
    }
    else {
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = sVar3;
      uVar4 = SUB168(auVar1 * ZEXT816(4),0);
      if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
        uVar4 = 0xffffffffffffffff;
      }
      puVar5 = (uint32_t *)operator_new__(uVar4);
      __s->code = puVar5;
      if (__s->code == (uint32_t *)0x0) {
        if (__s != (spv_binary)0x0) {
          operator_delete(__s,0x10);
        }
        *optimized_binary = (spv_binary)0x0;
        optimizer_local._4_4_ = SPV_ERROR_OUT_OF_MEMORY;
      }
      else {
        sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
        __s->wordCount = sVar3;
        puVar5 = __s->code;
        __src = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
        sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
        memcpy(puVar5,__src,sVar3 << 2);
        *optimized_binary = __s;
        optimizer_local._4_4_ = SPV_SUCCESS;
      }
    }
  }
  else {
    optimizer_local._4_4_ = SPV_ERROR_INTERNAL;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  return optimizer_local._4_4_;
}

Assistant:

SPIRV_TOOLS_EXPORT
spv_result_t spvOptimizerRun(spv_optimizer_t* optimizer,
                             const uint32_t* binary,
                             const size_t word_count,
                             spv_binary* optimized_binary,
                             const spv_optimizer_options options) {
  std::vector<uint32_t> optimized;

  if (!reinterpret_cast<spvtools::Optimizer*>(optimizer)->
      Run(binary, word_count, &optimized, options)) {
    return SPV_ERROR_INTERNAL;
  }

  auto result_binary = new spv_binary_t();
  if (!result_binary) {
      *optimized_binary = nullptr;
      return SPV_ERROR_OUT_OF_MEMORY;
  }

  result_binary->code = new uint32_t[optimized.size()];
  if (!result_binary->code) {
      delete result_binary;
      *optimized_binary = nullptr;
      return SPV_ERROR_OUT_OF_MEMORY;
  }
  result_binary->wordCount = optimized.size();

  memcpy(result_binary->code, optimized.data(),
         optimized.size() * sizeof(uint32_t));

  *optimized_binary = result_binary;

  return SPV_SUCCESS;
}